

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Question *pQVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pQVar1 = this->pos;
    this->pos = pQVar1 + -1;
    dtor<capnp::_::RpcSystemBase::RpcConnectionState::Question>(pQVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }